

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMyString.cpp
# Opt level: O1

CMyString * SubString(CMyString *__return_storage_ptr__,CMyString *CS,int pos,int len)

{
  int *__src;
  int iVar1;
  
  __src = (int *)malloc(0x408);
  *(undefined2 *)(__src + 1) = 0x20;
  *__src = 1;
  iVar1 = CS->length - pos;
  if (len + pos <= CS->length) {
    iVar1 = len;
  }
  memcpy(__src + 1,CS->str + pos,(long)iVar1);
  *__src = iVar1;
  *(undefined1 *)((long)__src + (long)iVar1 + 4U) = 0;
  memcpy(__return_storage_ptr__,__src,0x408);
  return __return_storage_ptr__;
}

Assistant:

CMyString SubString(CMyString *CS,const int pos,const int len)  //提取一个从pos位置起长度为len的子串
{
    int rlen = len;
    CMyString *tmpStr = (CMyString *)malloc(sizeof(CMyString));
    InitCMyString(tmpStr,(char *)" ");
    if(pos+len > CS->length)
        rlen = CS->length-pos;
    memcpy(tmpStr->str,CS->str+pos,rlen);
    tmpStr->length = rlen;
    tmpStr->str[tmpStr->length] = 0;
    return *tmpStr;
}